

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float32 float32_scalbn_arm(float32 a,int n,float_status *status)

{
  FloatParts FVar1;
  
  FVar1._8_8_ = (ulong)(a >> 0x17 & 0xff) | (ulong)(a & 0x80000000) << 9;
  FVar1.frac = (ulong)(a & 0x7fffff);
  FVar1 = sf_canonicalize(FVar1,&float32_params,status);
  FVar1 = scalbn_decomposed(FVar1,n,status);
  FVar1 = round_canonical(FVar1,status,&float32_params);
  return (uint)FVar1.frac & 0x7fffff | (FVar1.exp & 0xffU) << 0x17 |
         (uint)(FVar1._8_8_ >> 9) & 0x80000000;
}

Assistant:

float32 float32_scalbn(float32 a, int n, float_status *status)
{
    FloatParts pa = float32_unpack_canonical(a, status);
    FloatParts pr = scalbn_decomposed(pa, n, status);
    return float32_round_pack_canonical(pr, status);
}